

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O3

double __thiscall
Alg::max_cover_lazy_budget
          (Alg *this,Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list
          ,double *timeb,int mode)

{
  pointer *pppVar1;
  vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>> *this_00;
  _Bit_type *p_Var2;
  size_t sVar3;
  uint uVar4;
  iterator iVar5;
  pointer pvVar6;
  iterator iVar7;
  double dVar8;
  pointer pvVar9;
  ulong *puVar10;
  pointer pvVar11;
  void *pvVar12;
  double *pdVar13;
  pointer pvVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ostream *poVar18;
  long lVar19;
  pointer pdVar20;
  double *pdVar21;
  pointer puVar22;
  uint *puVar23;
  ulong *puVar24;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar25;
  pair<unsigned_long,_double> *ppVar26;
  pointer ppVar27;
  uint *puVar28;
  double *pdVar29;
  pointer ppVar30;
  pointer *ppuVar31;
  undefined1 auVar32 [8];
  ulong uVar33;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  __i_1;
  pair<unsigned_long,_double> *ppVar34;
  pointer ppVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  uint uVar40;
  long lVar41;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  __i;
  pointer puVar42;
  Alg *pAVar43;
  _Bit_type *p_Var44;
  size_t degBound;
  ulong uVar45;
  vector<double,_std::allocator<double>_> *budget_list_00;
  bool bVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined4 uVar56;
  undefined4 uVar57;
  undefined1 auVar58 [16];
  Nodelist vecBound_1;
  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  degMap_cost;
  Nodelist vecBound;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  miss_nodes_vec;
  vector<double,_std::allocator<double>_> coverage_cost;
  value_type argmaxIdx;
  FRset coverage;
  RRsets degMap;
  uint local_214;
  double local_210;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  vector<double,_std::allocator<double>_> *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  double local_1d0;
  Alg *local_1c8;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_1c0;
  ulong local_1b8;
  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  local_1b0;
  double local_198;
  int local_18c;
  undefined1 local_188 [8];
  _Bit_type *p_Stack_180;
  _Bit_type *local_178;
  _Bit_pointer local_168;
  pair<unsigned_long,_double> *local_158;
  iterator iStack_150;
  pair<unsigned_long,_double> *local_148;
  double local_140;
  uint *local_138;
  vector<double,_std::allocator<double>_> local_130;
  double local_118;
  undefined8 uStack_110;
  vector<bool,_std::allocator<bool>_> local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<bool,_std::allocator<bool>_> local_c8;
  double local_a0;
  long local_98;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_90;
  vector<bool,_std::allocator<bool>_> local_78;
  Nodelist *local_50;
  double *local_48;
  pointer local_40;
  long local_38;
  
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  this->__boundLast_inf = 1.79769313486232e+308;
  this->__boundMin_inf = 1.79769313486232e+308;
  this->__boundLast_inf_cost = 1.79769313486232e+308;
  this->__boundMin_inf_cost = 1.79769313486232e+308;
  local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_210 = budget;
  local_1f0 = budget_list;
  local_18c = mode;
  local_48 = timeb;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_e0,(ulong)this->__numV,(value_type_conflict2 *)&local_c8,
             (allocator_type *)&local_78);
  uVar17 = (ulong)this->__numV;
  if (uVar17 == 0) {
    uVar45 = 0;
  }
  else {
    ppuVar31 = (pointer *)
               ((long)&(this->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17 - 1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data + 8);
    uVar45 = 0;
    do {
      uVar36 = (long)*ppuVar31 - (long)((_Vector_impl_data *)(ppuVar31 + -1))->_M_start >> 3;
      if (uVar45 < uVar36) {
        uVar45 = uVar36;
      }
      ppuVar31 = ppuVar31 + -3;
      local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar17 - 1] = uVar36;
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_90,uVar45 + 1,(allocator_type *)&local_c8);
  uVar15 = this->__numV - 1;
  local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p._4_4_,uVar15);
  if (this->__numV != 0) {
    do {
      if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar15] != 0) {
        pvVar25 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                  (local_90.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                  local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar15]);
        iVar5._M_current = *(uint **)(pvVar25 + 8);
        if (iVar5._M_current == *(uint **)(pvVar25 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(pvVar25,iVar5,(uint *)&local_c8);
        }
        else {
          *iVar5._M_current = uVar15;
          *(uint **)(pvVar25 + 8) = iVar5._M_current + 1;
        }
      }
      bVar46 = (int)local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != 0;
      uVar15 = (int)local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p - 1;
      local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar15);
    } while (bVar46);
  }
  local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_1_ = (allocator_type)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_c8,this->__numRRsets,(bool *)&local_78,(allocator_type *)local_188);
  local_188 = (undefined1  [8])((ulong)local_188 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_78,(ulong)this->__numV,(bool *)local_188,(allocator_type *)&local_108);
  dVar47 = min_vector_nonzero_mask(local_1f0,&local_78);
  local_1e8._0_4_ = SUB84(dVar47,0);
  local_1e8._4_4_ = (undefined4)((ulong)dVar47 >> 0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"min_cost: ",10);
  poVar18 = std::ostream::_M_insert<double>((double)CONCAT44(local_1e8._4_4_,(undefined4)local_1e8))
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  puVar22 = (this->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar22) {
    (this->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar22;
  }
  lVar38 = 0;
  local_1c8 = this;
  if (((double)CONCAT44(local_1e8._4_4_,(undefined4)local_1e8) <= local_210) && (uVar45 != 0)) {
    local_1c0 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->__vecSeed_inf;
    lVar38 = 0;
    iVar16 = 0;
    lVar39 = CONCAT44(local_1e8._4_4_,(undefined4)local_1e8);
    do {
      local_1e8 = (double)(uVar45 * 3);
      lVar41 = (long)local_90.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar45].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_90.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar45].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (lVar41 != 0) {
        pvVar11 = local_90.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar45;
        lVar41 = lVar41 >> 2;
        do {
          local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p._0_4_ =
               (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar41 + -1];
          lVar41 = lVar41 + -1;
          if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start
              [(uint)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p] < uVar45) {
            pvVar25 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                      (local_90.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                      local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start
                      [(uint)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p]);
            iVar5._M_current = *(uint **)(pvVar25 + 8);
            if (iVar5._M_current == *(uint **)(pvVar25 + 0x10)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(pvVar25,iVar5,(uint *)&local_108);
            }
            else {
              *iVar5._M_current =
                   (uint)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              *(uint **)(pvVar25 + 8) = iVar5._M_current + 1;
            }
          }
          else {
            if ((local_1f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start
                [(uint)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p] <= local_210
               ) {
              if (local_18c == 2) {
                local_188 = (undefined1  [8])0x0;
                p_Stack_180 = (_Bit_type *)0x0;
                local_178 = (_Bit_type *)0x0;
                local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ =
                     (undefined4)
                     local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [(&((local_90.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start)[(long)local_1e8][lVar41]];
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_188,
                           (iterator)0x0,(uint *)&local_130);
                lVar39 = 0;
                for (auVar32 = local_188; auVar32 != (undefined1  [8])p_Stack_180;
                    auVar32 = (undefined1  [8])((long)auVar32 + 4)) {
                  lVar39 = lVar39 + (ulong)(uint)*(_Bit_type *)auVar32;
                }
                lVar39 = lVar39 + lVar38;
                auVar48._8_4_ = (int)((ulong)lVar39 >> 0x20);
                auVar48._0_8_ = lVar39;
                auVar48._12_4_ = 0x45300000;
                sVar3 = local_1c8->__numRRsets;
                auVar52._8_4_ = (int)(sVar3 >> 0x20);
                auVar52._0_8_ = sVar3;
                auVar52._12_4_ = 0x45300000;
                dVar47 = ((double)local_1c8->__numV *
                         ((auVar48._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar39) - 4503599627370496.0))) /
                         ((auVar52._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
                local_1c8->__boundLast_inf = dVar47;
                if (dVar47 < local_1c8->__boundMin_inf) {
                  local_1c8->__boundMin_inf = dVar47;
                }
                if (local_188 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_188,(long)local_178 - (long)local_188);
                }
              }
              if (iVar16 == 0) {
                lVar38 = lVar38 + local_e0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start
                                  [(uint)local_108.super__Bvector_base<std::allocator<bool>_>.
                                         _M_impl.super__Bvector_impl_data._M_start.
                                         super__Bit_iterator_base._M_p];
                iVar5._M_current =
                     (local_1c8->__vecSeed_inf).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (local_1c8->__vecSeed_inf).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>(local_1c0,iVar5,(uint *)&local_108);
                }
                else {
                  *iVar5._M_current =
                       (uint)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  (local_1c8->__vecSeed_inf).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                }
                uVar17 = (ulong)(uint)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p;
                local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17] = 0;
                pvVar9 = (local_1c8->__hyperG)._FRsets.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar24 = pvVar9[uVar17].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
                puVar10 = *(pointer *)
                           ((long)&pvVar9[uVar17].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data + 8);
                if (puVar24 != puVar10) {
                  pvVar6 = (local_1c8->__hyperG)._RRsets.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    uVar17 = *puVar24;
                    uVar36 = uVar17 + 0x3f;
                    if (-1 < (long)uVar17) {
                      uVar36 = uVar17;
                    }
                    uVar37 = (ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001);
                    if ((local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar36 >> 6) + (uVar37 - 1)] >> (uVar17 & 0x3f) & 1) == 0) {
                      local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      [((long)uVar36 >> 6) + (uVar37 - 1)] =
                           local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [((long)uVar36 >> 6) + (uVar37 - 1)] | 1L << ((byte)uVar17 & 0x3f);
                      puVar23 = *(pointer *)
                                 ((long)&pvVar6[uVar17].
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data + 8);
                      for (puVar28 = pvVar6[uVar17].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start; puVar28 != puVar23;
                          puVar28 = puVar28 + 1) {
                        if (local_e0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[*puVar28] != 0) {
                          local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[*puVar28] =
                               local_e0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[*puVar28] - 1;
                        }
                      }
                    }
                    puVar24 = puVar24 + 1;
                    local_1d0 = (double)lVar38;
                  } while (puVar24 != puVar10);
                }
              }
              iVar16 = iVar16 + 1;
            }
            if (iVar16 == 2) goto LAB_00106521;
          }
        } while (lVar41 != 0);
        lVar39 = (long)local_1e8;
        if (iVar16 == 2) break;
      }
      puVar22 = local_90.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar11 = local_90.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      local_1e8 = (double)lVar39;
      if (puVar22 != (pointer)0x0) {
        pvVar11 = local_90.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_90.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_90.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        operator_delete(puVar22,(long)(pvVar11->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)puVar22);
        pvVar11 = local_90.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_90.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar11;
      uVar45 = uVar45 - 1;
      lVar39 = (long)local_1e8;
    } while (uVar45 != 0);
  }
LAB_00106521:
  pAVar43 = local_1c8;
  uVar15 = local_1c8->__numV;
  local_1e8._0_4_ = (undefined4)local_1c8->__numRRsets;
  local_1e8._4_4_ = (undefined4)(local_1c8->__numRRsets >> 0x20);
  uStack_1e0 = 0;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ",0x1e);
  poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18," ",1);
  uVar57 = SUB164(ZEXT816(0x4530000043300000),4);
  auVar54._8_4_ = (int)((ulong)lVar38 >> 0x20);
  auVar54._0_8_ = lVar38;
  auVar54._12_4_ = uVar57;
  uVar56 = SUB164(ZEXT816(0x4530000043300000),0);
  auVar55._4_4_ = local_1e8._4_4_;
  auVar55._0_4_ = (undefined4)local_1e8;
  auVar55._8_4_ = local_1e8._4_4_;
  auVar55._12_4_ = uVar57;
  local_a0 = ((double)uVar15 *
             ((auVar54._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(uVar56,(int)lVar38) - 4503599627370496.0))) /
             ((auVar55._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(uVar56,(undefined4)local_1e8) - 4503599627370496.0));
  poVar18 = std::ostream::_M_insert<double>(local_a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,", min-bound: ",0xd);
  poVar18 = std::ostream::_M_insert<double>(pAVar43->__boundMin_inf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,", last-bound: ",0xe);
  poVar18 = std::ostream::_M_insert<double>(pAVar43->__boundLast_inf);
  local_188[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,local_188,1);
  local_188 = (undefined1  [8])0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_130,(ulong)pAVar43->__numV,(value_type_conflict4 *)local_188,
             (allocator_type *)&local_108);
  budget_list_00 = local_1f0;
  uVar17 = (ulong)pAVar43->__numV;
  if (uVar17 == 0) {
    uVar45 = 0;
  }
  else {
    pdVar20 = (local_1f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppuVar31 = (pointer *)
               ((long)&(pAVar43->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar17 - 1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data + 8);
    uVar45 = uVar17;
    do {
      lVar38 = (long)*ppuVar31 - (long)((_Vector_impl_data *)(ppuVar31 + -1))->_M_start;
      lVar39 = lVar38 >> 3;
      dVar47 = pdVar20[uVar45 - 1];
      auVar58._8_4_ = (int)(lVar38 >> 0x23);
      auVar58._0_8_ = lVar39;
      auVar58._12_4_ = 0x45300000;
      uVar36 = 0;
      if (*ppuVar31 != ((_Vector_impl_data *)(ppuVar31 + -1))->_M_start) {
        uVar36 = ~-(ulong)(ABS(dVar47) <= 1e-10) &
                 (ulong)(((auVar58._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar39) - 4503599627370496.0)) / dVar47);
      }
      ppuVar31 = ppuVar31 + -3;
      *(ulong *)(CONCAT44(local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + -8 + uVar45 * 8) = uVar36;
      uVar45 = uVar45 - 1;
    } while (uVar45 != 0);
    uVar45 = 0;
    do {
      uVar36 = (ulong)((int)*(double *)
                             (CONCAT44(local_130.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_130.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + -8 +
                             uVar17 * 8) + 1);
      if (uVar36 < uVar45) {
        uVar36 = uVar45;
      }
      uVar45 = uVar36;
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"maxDeg: ",8);
  poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  std::
  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  ::vector(&local_1b0,uVar45 + 1,(allocator_type *)local_188);
  p_Var44 = (_Bit_type *)(ulong)pAVar43->__numV;
  if (p_Var44 != (_Bit_type *)0x0) {
    do {
      p_Var44 = (_Bit_type *)((long)p_Var44 - 1);
      p_Var2 = *(_Bit_type **)
                (CONCAT44(local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + (long)p_Var44 * 8);
      if (1e-10 < ABS((double)p_Var2)) {
        iVar16 = (int)(double)p_Var2;
        iVar7._M_current =
             local_1b0.
             super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + 1].
             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_188 = (undefined1  [8])p_Var44;
        p_Stack_180 = p_Var2;
        if (iVar7._M_current ==
            local_1b0.
            super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + 1].
            super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>::
          _M_realloc_insert<std::pair<unsigned_long,double>>
                    ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                      *)(local_1b0.
                         super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)iVar16 + 1),iVar7,
                     (pair<unsigned_long,_double> *)local_188);
        }
        else {
          (iVar7._M_current)->first = (unsigned_long)p_Var44;
          (iVar7._M_current)->second = (double)p_Var2;
          pppVar1 = &local_1b0.
                     super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)iVar16 + 1].
                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
      }
    } while (p_Var44 != (_Bit_type *)0x0);
  }
  local_158 = (pair<unsigned_long,_double> *)0x0;
  iStack_150._M_current = (pair<unsigned_long,_double> *)0x0;
  local_148 = (pair<unsigned_long,_double> *)0x0;
  local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_4_ =
       (uint)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_188,pAVar43->__numRRsets,
             (bool *)&local_108,(allocator_type *)&local_208);
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_108,(ulong)pAVar43->__numV,(bool *)&local_208,(allocator_type *)&local_214);
  local_1d0 = min_vector_nonzero_mask(budget_list_00,&local_108);
  std::chrono::_V2::system_clock::now();
  puVar22 = (pAVar43->__vecSeed_inf_cost).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((pAVar43->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar22) {
    (pAVar43->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar22;
  }
  local_118 = 0.0;
  if ((uVar45 != 0) && (local_1d0 <= local_210)) {
    local_50 = &pAVar43->__vecSeed_inf_cost;
    local_118 = 0.0;
    local_198 = 0.0;
    do {
      lVar38 = uVar45 * 3;
      ppVar27 = local_1b0.
                super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar45].
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar30 = local_1b0.
                super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar45].
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_1b8 = uVar45;
      if (ppVar27 != ppVar30) {
        uVar17 = (long)ppVar30 - (long)ppVar27 >> 4;
        lVar39 = 0x3f;
        if (uVar17 != 0) {
          for (; uVar17 >> lVar39 == 0; lVar39 = lVar39 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__0>>
                  (ppVar27,ppVar30,((uint)lVar39 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)ppVar30 - (long)ppVar27 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__0>>
                    (ppVar27,ppVar30);
          budget_list_00 = local_1f0;
        }
        else {
          ppVar35 = ppVar27 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__0>>
                    (ppVar27,ppVar35);
          budget_list_00 = local_1f0;
          if (ppVar35 != ppVar30) {
            pdVar21 = &ppVar27[0x10].second;
            do {
              dVar8 = (double)ppVar35->first;
              dVar47 = ppVar35->second;
              dVar51 = ppVar35[-1].second;
              ppVar27 = ppVar35;
              pdVar13 = pdVar21;
              if (dVar47 < dVar51) {
                do {
                  pdVar29 = pdVar13;
                  ((pair<unsigned_long,_double> *)(pdVar29 + -1))->first =
                       (unsigned_long)pdVar29[-3];
                  *pdVar29 = dVar51;
                  dVar51 = pdVar29[-4];
                  pdVar13 = pdVar29 + -2;
                } while (dVar47 < dVar51);
                ppVar27 = (pointer)(pdVar29 + -3);
              }
              ppVar27->first = (unsigned_long)dVar8;
              ppVar27->second = dVar47;
              ppVar35 = ppVar35 + 1;
              pdVar21 = pdVar21 + 2;
            } while (ppVar35 != ppVar30);
          }
        }
      }
      pvVar25 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                ((long)local_1b0.
                       super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar45].
                       super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1b0.
                      super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar45].
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      pAVar43 = local_1c8;
      uVar17 = local_1b8;
      if (pvVar25 != (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0) {
        local_40 = local_1b0.
                   super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar45;
        lVar39 = (long)pvVar25 >> 4;
        local_98 = lVar38;
        do {
          local_38 = lVar39 + -1;
          puVar23 = (uint *)(local_40->
                            super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[local_38].first;
          lVar41 = CONCAT44(local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
          puVar28 = *(uint **)(lVar41 + (long)puVar23 * 8);
          local_1c0 = pvVar25;
          if ((ulong)(long)((int)(double)puVar28 + 1) < uVar17) {
            this_00 = (vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                       *)(local_1b0.
                          super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + ((int)(double)puVar28 + 1));
            iVar7._M_current = *(pair<unsigned_long,_double> **)(this_00 + 8);
            if (iVar7._M_current == *(pair<unsigned_long,_double> **)(this_00 + 0x10)) {
              local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = puVar23;
              local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar28;
              std::
              vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
              ::_M_realloc_insert<std::pair<unsigned_long,double>>
                        (this_00,iVar7,(pair<unsigned_long,_double> *)&local_208);
            }
            else {
              (iVar7._M_current)->first = (unsigned_long)puVar23;
              (iVar7._M_current)->second = (double)puVar28;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
              local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = puVar23;
              local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar28;
            }
            pppVar1 = &((local_1b0.
                         super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + lVar38;
            *pppVar1 = *pppVar1 + -1;
          }
          else {
            pdVar20 = (budget_list_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            dVar47 = pdVar20[(long)puVar23];
            if (local_198 + dVar47 <= local_210) {
              local_138 = puVar23;
              if (local_18c == 2) {
                local_140 = (double)std::chrono::_V2::system_clock::now();
                iVar7._M_current = iStack_150._M_current;
                ppVar26 = local_158;
                uVar17 = (long)iStack_150._M_current - (long)local_158 >> 4;
                local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (uint *)0x0;
                local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (uint *)0x0;
                local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
                lVar38 = (long)iStack_150._M_current - (long)local_158;
                if (iStack_150._M_current != local_158) {
                  pdVar21 = &local_158[uVar17 - 1].second;
                  uVar45 = uVar17;
                  do {
                    *pdVar21 = *(double *)
                                (CONCAT44(local_130.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                                          local_130.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                ((pair<unsigned_long,_double> *)(pdVar21 + -1))->first * 8);
                    pdVar21 = pdVar21 + -2;
                    uVar45 = uVar45 - 1;
                  } while (uVar45 != 0);
                  if (iStack_150._M_current != local_158) {
                    lVar41 = 0x3f;
                    if (uVar17 != 0) {
                      for (; uVar17 >> lVar41 == 0; lVar41 = lVar41 + -1) {
                      }
                    }
                    std::
                    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__1>>
                              (local_158,iStack_150._M_current,((uint)lVar41 ^ 0x3f) * 2 ^ 0x7e);
                    if (lVar38 < 0x101) {
                      std::
                      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__1>>
                                (ppVar26,iVar7._M_current);
                    }
                    else {
                      ppVar34 = ppVar26 + 0x10;
                      std::
                      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__1>>
                                (ppVar26,ppVar34);
                      if (ppVar34 != iVar7._M_current) {
                        pdVar21 = &ppVar26[0x10].second;
                        do {
                          dVar8 = (double)ppVar34->first;
                          dVar47 = ppVar34->second;
                          dVar51 = ppVar34[-1].second;
                          ppVar26 = ppVar34;
                          pdVar13 = pdVar21;
                          if (dVar47 < dVar51) {
                            do {
                              pdVar29 = pdVar13;
                              ((pair<unsigned_long,_double> *)(pdVar29 + -1))->first =
                                   (unsigned_long)pdVar29[-3];
                              *pdVar29 = dVar51;
                              dVar51 = pdVar29[-4];
                              pdVar13 = pdVar29 + -2;
                            } while (dVar47 < dVar51);
                            ppVar26 = (pair<unsigned_long,_double> *)(pdVar29 + -3);
                          }
                          ppVar26->first = (unsigned_long)dVar8;
                          ppVar26->second = dVar47;
                          ppVar34 = ppVar34 + 1;
                          pdVar21 = pdVar21 + 2;
                        } while (ppVar34 != iVar7._M_current);
                      }
                    }
                  }
                }
                lVar38 = local_98;
                uVar15 = (int)uVar17 - 1;
                local_1e8 = 0.0;
                if (local_1d0 <= local_210) {
                  local_1e8 = 0.0;
                  lVar41 = -1;
                  pvVar25 = local_1c0;
                  do {
                    lVar41 = lVar41 + 1;
                    if (lVar39 == lVar41) break;
                    ppVar27 = (&((local_1b0.
                                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)[lVar38];
                    if ((int)uVar15 < 0) {
                      lVar19 = *(long *)(pvVar25 + (long)(ppVar27 + -1));
                      pdVar20 = (local_1f0->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      if (local_210 < local_1e8 + pdVar20[lVar19]) {
                        local_214 = (uint)(long)((local_210 - local_1e8) *
                                                *(double *)(pvVar25 + (long)&ppVar27[-1].second));
                        if (local_208.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            local_208.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&local_208,
                                     (iterator)
                                     local_208.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_214);
                        }
                        else {
LAB_00107364:
                          *local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish = local_214;
                          local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish =
                               local_208.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                        goto LAB_0010736f;
                      }
                      local_214 = (uint)(long)(pdVar20[lVar19] *
                                              *(double *)(pvVar25 + (long)&ppVar27[-1].second));
                      if (local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                          local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        _M_realloc_insert<unsigned_int>
                                  (&local_208,
                                   (iterator)
                                   local_208.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,&local_214);
                        lVar19 = *(long *)(pvVar25 +
                                          (long)((&((local_1b0.
                                                                                                          
                                                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)
                                                 [lVar38] + -1));
                        pdVar20 = (local_1f0->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start;
                      }
                      else {
                        *local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish = local_214;
                        local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_208.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish + 1;
                      }
                      pdVar21 = pdVar20 + lVar19;
                    }
                    else {
                      dVar47 = *(double *)(pvVar25 + (long)&ppVar27[-1].second);
                      dVar51 = local_158[uVar15].second;
                      pdVar20 = (local_1f0->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      if (dVar51 <= dVar47) {
                        lVar19 = *(long *)(pvVar25 + (long)(ppVar27 + -1));
                        if (local_210 < local_1e8 + pdVar20[lVar19]) {
                          local_214 = (uint)(long)((local_210 - local_1e8) * dVar47);
                          if (local_208.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish !=
                              local_208.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00107364;
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&local_208,
                                     (iterator)
                                     local_208.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_214);
                          goto LAB_0010736f;
                        }
                        local_214 = (uint)(long)(dVar47 * pdVar20[lVar19]);
                        if (local_208.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            local_208.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&local_208,
                                     (iterator)
                                     local_208.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_214);
                          lVar19 = *(long *)(pvVar25 +
                                            (long)((&((local_1b0.
                                                                                                              
                                                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)
                                                  [lVar38] + -1));
                          pdVar20 = (local_1f0->super__Vector_base<double,_std::allocator<double>_>)
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                        else {
                          *local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish = local_214;
                          local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish =
                               local_208.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                        pdVar21 = pdVar20 + lVar19;
                      }
                      else {
                        dVar47 = (double)local_158[uVar15].first;
                        if (local_210 < local_1e8 + pdVar20[(long)dVar47]) {
                          local_214 = (uint)(long)((local_210 - local_1e8) * dVar51);
                          if (local_208.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish !=
                              local_208.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00107364;
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&local_208,
                                     (iterator)
                                     local_208.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_214);
                          goto LAB_0010736f;
                        }
                        local_214 = (uint)(long)(dVar51 * pdVar20[(long)dVar47]);
                        if (local_208.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            local_208.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                          _M_realloc_insert<unsigned_int>
                                    (&local_208,
                                     (iterator)
                                     local_208.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_214);
                          dVar47 = (double)local_158[uVar15].first;
                          pdVar20 = (local_1f0->super__Vector_base<double,_std::allocator<double>_>)
                                    ._M_impl.super__Vector_impl_data._M_start;
                        }
                        else {
                          *local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish = local_214;
                          local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish =
                               local_208.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 1;
                        }
                        pdVar21 = pdVar20 + (long)dVar47;
                        uVar15 = uVar15 - 1;
                      }
                    }
                    pvVar25 = pvVar25 + -0x10;
                    local_1e8 = local_1e8 + *pdVar21;
                  } while (local_1d0 + local_1e8 <= local_210);
                }
                uVar17 = local_1b8;
                if (local_1d0 + local_1e8 <= local_210) {
                  while (uVar17 = uVar17 - 1, uVar17 != 0) {
                    ppVar27 = local_1b0.
                              super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar17].
                              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    ppVar30 = local_1b0.
                              super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar17].
                              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    if (ppVar27 != ppVar30) {
                      uVar45 = (long)ppVar30 - (long)ppVar27 >> 4;
                      lVar38 = 0x3f;
                      if (uVar45 != 0) {
                        for (; uVar45 >> lVar38 == 0; lVar38 = lVar38 + -1) {
                        }
                      }
                      std::
                      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__2>>
                                (ppVar27,ppVar30,((uint)lVar38 ^ 0x3f) * 2 ^ 0x7e);
                      if ((long)ppVar30 - (long)ppVar27 < 0x101) {
                        std::
                        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__2>>
                                  (ppVar27,ppVar30);
                      }
                      else {
                        ppVar35 = ppVar27 + 0x10;
                        std::
                        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__2>>
                                  (ppVar27,ppVar35);
                        if (ppVar35 != ppVar30) {
                          pdVar21 = &ppVar27[0x10].second;
                          do {
                            dVar8 = (double)ppVar35->first;
                            dVar47 = ppVar35->second;
                            dVar51 = ppVar35[-1].second;
                            ppVar27 = ppVar35;
                            pdVar13 = pdVar21;
                            if (dVar47 < dVar51) {
                              do {
                                pdVar29 = pdVar13;
                                ((pair<unsigned_long,_double> *)(pdVar29 + -1))->first =
                                     (unsigned_long)pdVar29[-3];
                                *pdVar29 = dVar51;
                                dVar51 = pdVar29[-4];
                                pdVar13 = pdVar29 + -2;
                              } while (dVar47 < dVar51);
                              ppVar27 = (pointer)(pdVar29 + -3);
                            }
                            ppVar27->first = (unsigned_long)dVar8;
                            ppVar27->second = dVar47;
                            ppVar35 = ppVar35 + 1;
                            pdVar21 = pdVar21 + 2;
                          } while (ppVar35 != ppVar30);
                        }
                      }
                    }
                    dVar47 = local_1d0 + local_1e8;
                    if (dVar47 <= local_210) {
                      lVar38 = (long)local_1b0.
                                     super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_1b0.
                                     super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                     super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      lVar39 = (lVar38 >> 4) + 1;
                      do {
                        lVar39 = lVar39 + -1;
                        if (lVar39 == 0) {
                          dVar47 = local_1d0 + local_1e8;
                          break;
                        }
                        ppVar27 = local_1b0.
                                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        if ((int)uVar15 < 0) {
                          lVar41 = *(long *)((long)&ppVar27[-1].first + lVar38);
                          pdVar20 = (local_1f0->super__Vector_base<double,_std::allocator<double>_>)
                                    ._M_impl.super__Vector_impl_data._M_start;
                          if (local_210 < local_1e8 + pdVar20[lVar41]) {
                            local_214 = (uint)(long)((local_210 - local_1e8) *
                                                    *(double *)((long)ppVar27 + lVar38 + -8));
                            if (local_208.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish !=
                                local_208.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)
                            goto LAB_00107364;
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                            _M_realloc_insert<unsigned_int>
                                      (&local_208,
                                       (iterator)
                                       local_208.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,&local_214);
                            goto LAB_0010736f;
                          }
                          local_214 = (uint)(long)(pdVar20[lVar41] *
                                                  *(double *)((long)ppVar27 + lVar38 + -8));
                          if (local_208.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish ==
                              local_208.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                            _M_realloc_insert<unsigned_int>
                                      (&local_208,
                                       (iterator)
                                       local_208.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,&local_214);
                            lVar41 = *(long *)((long)&local_1b0.
                                                                                                            
                                                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  first + lVar38);
                            pdVar20 = (local_1f0->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data._M_start;
                          }
                          else {
                            *local_208.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish = local_214;
                            local_208.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 local_208.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 1;
                          }
                          pdVar21 = pdVar20 + lVar41;
                        }
                        else {
                          dVar47 = *(double *)((long)ppVar27 + lVar38 + -8);
                          dVar51 = local_158[uVar15].second;
                          pdVar20 = (local_1f0->super__Vector_base<double,_std::allocator<double>_>)
                                    ._M_impl.super__Vector_impl_data._M_start;
                          if (dVar51 <= dVar47) {
                            lVar41 = *(long *)((long)&ppVar27[-1].first + lVar38);
                            if (local_210 < local_1e8 + pdVar20[lVar41]) {
                              local_214 = (uint)(long)((local_210 - local_1e8) * dVar47);
                              if (local_208.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish !=
                                  local_208.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                              goto LAB_00107364;
                              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                              _M_realloc_insert<unsigned_int>
                                        (&local_208,
                                         (iterator)
                                         local_208.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_214);
                              goto LAB_0010736f;
                            }
                            local_214 = (uint)(long)(dVar47 * pdVar20[lVar41]);
                            if (local_208.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish ==
                                local_208.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                              _M_realloc_insert<unsigned_int>
                                        (&local_208,
                                         (iterator)
                                         local_208.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_214);
                              lVar41 = *(long *)((long)&local_1b0.
                                                                                                                
                                                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  first + lVar38);
                              pdVar20 = (local_1f0->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_start;
                            }
                            else {
                              *local_208.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish = local_214;
                              local_208.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish =
                                   local_208.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            pdVar21 = pdVar20 + lVar41;
                          }
                          else {
                            dVar47 = (double)local_158[uVar15].first;
                            if (local_210 < local_1e8 + pdVar20[(long)dVar47]) {
                              local_214 = (uint)(long)((local_210 - local_1e8) * dVar51);
                              if (local_208.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish !=
                                  local_208.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                              goto LAB_00107364;
                              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                              _M_realloc_insert<unsigned_int>
                                        (&local_208,
                                         (iterator)
                                         local_208.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_214);
                              goto LAB_0010736f;
                            }
                            local_214 = (uint)(long)(dVar51 * pdVar20[(long)dVar47]);
                            if (local_208.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish ==
                                local_208.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                              _M_realloc_insert<unsigned_int>
                                        (&local_208,
                                         (iterator)
                                         local_208.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_214);
                              dVar47 = (double)local_158[uVar15].first;
                              pdVar20 = (local_1f0->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_start;
                            }
                            else {
                              *local_208.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish = local_214;
                              local_208.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish =
                                   local_208.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            pdVar21 = pdVar20 + (long)dVar47;
                            uVar15 = uVar15 - 1;
                          }
                        }
                        lVar38 = lVar38 + -0x10;
                        local_1e8 = local_1e8 + *pdVar21;
                        dVar47 = local_1d0 + local_1e8;
                      } while (dVar47 <= local_210);
                    }
                    if (local_210 < dVar47) break;
                  }
                }
LAB_0010736f:
                puVar42 = local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                puVar22 = local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                puVar23 = local_138;
                budget_list_00 = local_1f0;
                if (local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  uVar17 = (long)local_208.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_208.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2;
                  lVar38 = 0x3f;
                  if (uVar17 != 0) {
                    for (; uVar17 >> lVar38 == 0; lVar38 = lVar38 + -1) {
                    }
                  }
                  std::
                  __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (local_208.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,
                             local_208.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,((uint)lVar38 ^ 0x3f) * 2 ^ 0x7e);
                  puVar23 = local_138;
                  budget_list_00 = local_1f0;
                  std::
                  __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (puVar22,puVar42);
                  puVar22 = local_208.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                }
                pAVar43 = local_1c8;
                uVar17 = (long)puVar22 -
                         (long)local_208.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                if ((1 < uVar17) && (1 < uVar17 + 1)) {
                  uVar45 = uVar17 + 1 >> 1;
                  do {
                    uVar33 = uVar45 - 1;
                    uVar15 = local_208.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar45 - 1];
                    uVar36 = uVar45 * 2 - 1;
                    uVar37 = uVar33;
                    if (uVar36 < uVar17) {
                      lVar38 = uVar45 * 2 + -2;
                      do {
                        uVar4 = local_208.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar36];
                        uVar45 = uVar36;
                        uVar40 = uVar4;
                        if ((lVar38 + 2U != uVar17) &&
                           (uVar45 = lVar38 + 2U,
                           uVar40 = local_208.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar38 + 2],
                           uVar4 < local_208.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar38 + 2])) {
                          uVar45 = uVar36;
                          uVar40 = uVar4;
                        }
                        if (uVar15 <= uVar40) break;
                        local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar37] = uVar40;
                        lVar38 = uVar45 * 2;
                        uVar36 = uVar45 * 2 + 1;
                        uVar37 = uVar45;
                      } while (uVar36 < uVar17);
                    }
                    local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar37] = uVar15;
                    uVar45 = uVar33;
                  } while (uVar33 != 0);
                }
                lVar38 = 0;
                for (puVar42 = local_208.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start; puVar42 != puVar22;
                    puVar42 = puVar42 + 1) {
                  lVar38 = lVar38 + (ulong)*puVar42;
                }
                lVar38 = lVar38 + (long)local_118;
                auVar49._8_4_ = (int)((ulong)lVar38 >> 0x20);
                auVar49._0_8_ = lVar38;
                auVar49._12_4_ = 0x45300000;
                sVar3 = local_1c8->__numRRsets;
                auVar53._8_4_ = (int)(sVar3 >> 0x20);
                auVar53._0_8_ = sVar3;
                auVar53._12_4_ = 0x45300000;
                dVar47 = ((double)local_1c8->__numV *
                         ((auVar49._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar38) - 4503599627370496.0))) /
                         ((auVar53._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0));
                local_1c8->__boundLast_inf_cost = dVar47;
                if (dVar47 < local_1c8->__boundMin_inf_cost) {
                  local_1c8->__boundMin_inf_cost = dVar47;
                }
                lVar38 = std::chrono::_V2::system_clock::now();
                *local_48 = (double)(lVar38 - (long)local_140) / 1000000000.0 + *local_48;
                if (local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start != (uint *)0x0) {
                  operator_delete(local_208.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_208.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_208.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                lVar41 = CONCAT44(local_130.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_130.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_);
                puVar28 = *(uint **)(lVar41 + (long)puVar23 * 8);
                pdVar20 = (budget_list_00->super__Vector_base<double,_std::allocator<double>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                dVar47 = pdVar20[(long)puVar23];
              }
              auVar50._0_8_ = (double)CONCAT44(0x43300000,SUB84(local_118,0));
              auVar50._8_4_ = (int)((ulong)local_118 >> 0x20);
              auVar50._12_4_ = 0x45300000;
              local_1e8 = (double)puVar28 * dVar47 +
                          (auVar50._8_8_ - 1.9342813113834067e+25) +
                          (auVar50._0_8_ - 4503599627370496.0);
              uStack_1e0 = 0;
              local_118 = local_1e8 - 9.223372036854776e+18;
              uStack_110 = 0;
              local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_208.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,(uint)local_138
                                    );
              iVar5._M_current =
                   (pAVar43->__vecSeed_inf_cost).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (pAVar43->__vecSeed_inf_cost).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>(local_50,iVar5,(uint *)&local_208);
                pdVar20 = (budget_list_00->super__Vector_base<double,_std::allocator<double>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                local_140 = pdVar20[(long)local_138];
                lVar41 = CONCAT44(local_130.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_130.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_);
              }
              else {
                *iVar5._M_current = (uint)local_138;
                (pAVar43->__vecSeed_inf_cost).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                local_140 = dVar47;
              }
              puVar28 = local_138;
              *(undefined8 *)(lVar41 + (long)local_138 * 8) = 0;
              puVar23 = (uint *)((long)local_138 + 0x3f);
              if (-1 < (long)local_138) {
                puVar23 = local_138;
              }
              puVar24 = (ulong *)(((long)puVar23 >> 6) * 8 +
                                  CONCAT44(local_108.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base._M_p._4_4_,
                                           (uint)local_108.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) + -8 +
                                 (ulong)(((ulong)local_138 & 0x800000000000003f) <
                                        0x8000000000000001) * 8);
              *puVar24 = *puVar24 | 1L << ((byte)local_138 & 0x3f);
              local_1d0 = min_vector_nonzero_mask(budget_list_00,&local_108);
              lVar38 = local_98;
              pvVar9 = (pAVar43->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar24 = pvVar9[(long)puVar28].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar10 = *(pointer *)
                         ((long)&pvVar9[(long)puVar28].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data + 8);
              if (puVar24 != puVar10) {
                pvVar11 = (pAVar43->__hyperG)._RRsets.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  uVar17 = *puVar24;
                  uVar45 = uVar17 + 0x3f;
                  if (-1 < (long)uVar17) {
                    uVar45 = uVar17;
                  }
                  uVar36 = (ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001);
                  if ((*(ulong *)((long)local_188 + (((long)uVar45 >> 6) + (uVar36 - 1)) * 8) >>
                       (uVar17 & 0x3f) & 1) == 0) {
                    *(ulong *)((long)local_188 + (((long)uVar45 >> 6) + (uVar36 - 1)) * 8) =
                         *(ulong *)((long)local_188 + (((long)uVar45 >> 6) + (uVar36 - 1)) * 8) |
                         1L << ((byte)uVar17 & 0x3f);
                    puVar23 = *(pointer *)
                               ((long)&pvVar11[uVar17].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + 8);
                    for (puVar28 = pvVar11[uVar17].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start; puVar28 != puVar23;
                        puVar28 = puVar28 + 1) {
                      uVar17 = (ulong)*puVar28;
                      dVar47 = *(double *)(lVar41 + uVar17 * 8);
                      if ((dVar47 != 0.0) || (NAN(dVar47))) {
                        *(double *)(lVar41 + uVar17 * 8) =
                             (dVar47 * pdVar20[uVar17] + -1.0) / pdVar20[uVar17];
                      }
                    }
                  }
                  puVar24 = puVar24 + 1;
                } while (puVar24 != puVar10);
              }
              local_118 = (double)((long)local_118 & (long)local_1e8 >> 0x3f | (long)local_1e8);
              local_198 = local_198 + local_140;
              pppVar1 = &((local_1b0.
                           super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_98;
              ppVar27 = pppVar1[1] + -1;
              pppVar1[1] = ppVar27;
              uVar17 = local_1b8;
              do {
                ppVar30 = local_1b0.
                          super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar17].
                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                lVar39 = (long)ppVar30 -
                         (long)local_1b0.
                               super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar17].
                               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                if (lVar39 != 0) {
                  lVar39 = lVar39 >> 4;
                  pdVar21 = &ppVar30[-1].second;
                  do {
                    *pdVar21 = *(double *)
                                (lVar41 + ((pair<unsigned_long,_double> *)(pdVar21 + -1))->first * 8
                                );
                    pdVar21 = pdVar21 + -2;
                    lVar39 = lVar39 + -1;
                  } while (lVar39 != 0);
                }
                uVar17 = uVar17 - 1;
              } while (uVar17 != 0);
              ppVar30 = *pppVar1;
              budget_list_00 = local_1f0;
              if (ppVar30 != ppVar27) {
                uVar17 = (long)ppVar27 - (long)ppVar30 >> 4;
                lVar39 = 0x3f;
                if (uVar17 != 0) {
                  for (; uVar17 >> lVar39 == 0; lVar39 = lVar39 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__3>>
                          (ppVar30,ppVar27,((uint)lVar39 ^ 0x3f) * 2 ^ 0x7e);
                if ((long)ppVar27 - (long)ppVar30 < 0x101) {
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__3>>
                            (ppVar30,ppVar27);
                  budget_list_00 = local_1f0;
                }
                else {
                  ppVar35 = ppVar30 + 0x10;
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double&,int)::__3>>
                            (ppVar30,ppVar35);
                  pAVar43 = local_1c8;
                  budget_list_00 = local_1f0;
                  if (ppVar35 != ppVar27) {
                    pdVar21 = &ppVar30[0x10].second;
                    do {
                      dVar8 = (double)ppVar35->first;
                      dVar47 = ppVar35->second;
                      dVar51 = ppVar35[-1].second;
                      ppVar30 = ppVar35;
                      pdVar13 = pdVar21;
                      if (dVar47 < dVar51) {
                        do {
                          pdVar29 = pdVar13;
                          ((pair<unsigned_long,_double> *)(pdVar29 + -1))->first =
                               (unsigned_long)pdVar29[-3];
                          *pdVar29 = dVar51;
                          dVar51 = pdVar29[-4];
                          pdVar13 = pdVar29 + -2;
                        } while (dVar47 < dVar51);
                        ppVar30 = (pointer)(pdVar29 + -3);
                      }
                      ppVar30->first = (unsigned_long)dVar8;
                      ppVar30->second = dVar47;
                      ppVar35 = ppVar35 + 1;
                      pdVar21 = pdVar21 + 2;
                    } while (ppVar35 != ppVar27);
                  }
                }
              }
            }
            else {
              if (iStack_150._M_current == local_148) {
                local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = puVar23;
                local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = puVar28;
                std::
                vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                ::_M_realloc_insert<std::pair<unsigned_long,double>>
                          ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                            *)&local_158,iStack_150,(pair<unsigned_long,_double> *)&local_208);
              }
              else {
                (iStack_150._M_current)->first = (unsigned_long)puVar23;
                (iStack_150._M_current)->second = (double)puVar28;
                iStack_150._M_current = iStack_150._M_current + 1;
                local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = puVar23;
                local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = puVar28;
              }
              pppVar1 = &((local_1b0.
                           super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish + lVar38;
              *pppVar1 = *pppVar1 + -1;
            }
            uVar17 = local_1b8;
            if (local_210 < local_198 + local_1d0) break;
          }
          pvVar25 = local_1c0 + -0x10;
          lVar39 = local_38;
        } while (local_38 != 0);
      }
      ppVar27 = local_1b0.
                super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar14 = local_1b0.
                super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      if (ppVar27 != (pointer)0x0) {
        pvVar14 = local_1b0.
                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_1b0.
        super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1b0.
             super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        operator_delete(ppVar27,(long)(pvVar14->
                                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                      )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppVar27);
        pvVar14 = local_1b0.
                  super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_1b0.
      super__Vector_base<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar14;
      uVar45 = uVar17 - 1;
    } while ((uVar45 != 0) && (local_198 + local_1d0 <= local_210));
  }
  uVar15 = pAVar43->__numV;
  local_1e8._0_4_ = (undefined4)pAVar43->__numRRsets;
  local_1e8._4_4_ = (undefined4)(pAVar43->__numRRsets >> 0x20);
  uStack_1e0 = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  >>>[greedy-lazy] influence_cost: ",0x23);
  poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18," ",1);
  local_1e8 = ((double)uVar15 *
              (((double)CONCAT44(0x45300000,(int)((ulong)local_118 >> 0x20)) -
               1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,SUB84(local_118,0)) - 4503599627370496.0))) /
              (((double)CONCAT44(0x45300000,local_1e8._4_4_) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(undefined4)local_1e8) - 4503599627370496.0));
  poVar18 = std::ostream::_M_insert<double>(local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,", min-bound_cost: ",0x12);
  poVar18 = std::ostream::_M_insert<double>(pAVar43->__boundMin_inf_cost);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,", last-bound_cost: ",0x13);
  poVar18 = std::ostream::_M_insert<double>(pAVar43->__boundLast_inf_cost);
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_208,1);
  bVar46 = local_a0 <= local_1e8;
  if (bVar46) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar43->__vecSeed,
               (pAVar43->__vecSeed_inf_cost).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (pAVar43->__vecSeed_inf_cost).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cost Inf: ",10);
    poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
  }
  else {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar43->__vecSeed,
               (pAVar43->__vecSeed_inf).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (pAVar43->__vecSeed_inf).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Inf: ",5);
    poVar18 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
    local_1e8 = local_a0;
  }
  pAVar43->__is_inf_cost = bVar46;
  pvVar12 = (void *)CONCAT44(local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                             (uint)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if (pvVar12 != (void *)0x0) {
    operator_delete(pvVar12,(long)local_108.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage - (long)pvVar12);
  }
  if (local_188 != (undefined1  [8])0x0) {
    operator_delete((void *)local_188,(long)local_168 - (long)local_188);
    local_188 = (undefined1  [8])0x0;
  }
  if (local_158 != (pair<unsigned_long,_double> *)0x0) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  std::
  vector<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>_>
  ::~vector(&local_1b0);
  pvVar12 = (void *)CONCAT44(local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_);
  if (pvVar12 != (void *)0x0) {
    operator_delete(pvVar12,(long)local_130.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar12)
    ;
  }
  pvVar12 = (void *)CONCAT71(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                             local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_);
  if (pvVar12 != (void *)0x0) {
    operator_delete(pvVar12,(long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage - (long)pvVar12);
  }
  if (local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_90);
  if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_1e8;
}

Assistant:

double Alg::max_cover_lazy_budget(const Graph & graph, const double budget,
        const std::vector<double> & budget_list, double & timeb, const int mode) {
    // mode: optimization mode.
    // 0->no optimization,
    // 1->optimization with the upper bound in the last round,
    // 2->optimization with minimum upper bound among all rounds [Default].
    const double EPS = 0.0000000001;
    __boundLast = DBL_MAX, __boundMin = DBL_MAX;
    __boundLast_inf = DBL_MAX, __boundMin_inf = DBL_MAX;
    __boundLast_inf_cost = DBL_MAX, __boundMin_inf_cost = DBL_MAX;
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;) {
        const size_t deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) {
            maxDeg = deg;
        }
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;) {
        if (coverage[i] == 0) {
            continue;
        }
        degMap[coverage[i]].push_back(i);
    }

    size_t sumInf = 0;
    int flag = 0;
    // check if an edge is removed
    std::vector<bool> edgeMark(__numRRsets, false);
    // check if an edge is removed
    std::vector<bool> node_sel(__numV, false);
    double min_cost = min_vector_nonzero_mask(budget_list, node_sel);
    std::cout << "min_cost: " << min_cost << std::endl;

    __vecSeed_inf.clear();
    for (size_t deg = maxDeg; deg > 0; deg--) // Enusre deg > 0
    {
        if (min_cost > budget) {
            break;
        }
        auto & vecNode = degMap[deg];
        for (auto idx = vecNode.size(); idx--;) {
            auto argmaxIdx = vecNode[idx];
            const auto currDeg = coverage[argmaxIdx];
            if (deg > currDeg)
            {
                degMap[currDeg].push_back(argmaxIdx);
                continue;
            }
            if (budget_list[argmaxIdx] <= budget) {
                if (mode == 2) {
                    // Find upper bound
                    auto degBound = deg;
                    Nodelist vecBound;
                    // Initialize vecBound
                    auto idxBound = idx;
                    vecBound.push_back(coverage[degMap[degBound][idxBound]]);
                    __boundLast_inf = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                             + sumInf) * __numV /__numRRsets;
                    if (__boundMin_inf > __boundLast_inf) {
                        __boundMin_inf = __boundLast_inf;
                    }
                }
                if (flag == 0) {
                    sumInf = sumInf + coverage[argmaxIdx];
                    __vecSeed_inf.push_back(argmaxIdx);
                    coverage[argmaxIdx] = 0;
                    for (auto edgeIdx : __hyperG._FRsets[argmaxIdx])
                    {
                        if (edgeMark[edgeIdx]) continue;
                        edgeMark[edgeIdx] = true;
                        for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
                        {
                            if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                            coverage[nodeIdx]--;
                        }
                    }
                }
                flag = flag + 1;
            }
            if (flag == 2) {
                break;
            }
        }
        if (flag == 2) {
            break;
        }
        degMap.pop_back();
    }
    // Top-k influential nodes constructed
    const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
    std::cout << std::endl;
    std::cout << "  >>>[greedy-lazy] influence: " << sumInf << " " << finalInf <<
              ", min-bound: " << __boundMin_inf <<
              ", last-bound: " << __boundLast_inf << '\n';

    // cost influence most
    std::vector<double> coverage_cost(__numV, 0);
    size_t maxDeg_cost = 0;
    for (auto i = __numV; i--;) {
        const size_t deg_cost = __hyperG._FRsets[i].size();
        if (fabs(budget_list[i]) <= EPS || deg_cost == 0) {
            coverage_cost[i] = 0;
        }
        else {
            coverage_cost[i] = (double) deg_cost / budget_list[i];
        }
    }

    // Normalization
    for (auto i = __numV; i--;) {
        if (int(coverage_cost[i]) + 1 > maxDeg_cost) {
            maxDeg_cost = int(coverage_cost[i]) + 1;
        }
    }
    std::cout << "maxDeg: " << maxDeg_cost << std::endl;

    // int(u.inf/u.cost) -> sort(pair<u.id, u.inf/u.cost>)
    std::vector<std::vector<std::pair<size_t, double>>> degMap_cost(maxDeg_cost + 1);
    for (auto i = __numV; i--;) {
        if (fabs(coverage_cost[i]) <= EPS) {
            continue;
        }
        degMap_cost[int(coverage_cost[i]) + 1].push_back(std::make_pair(i, coverage_cost[i]));
    }

    size_t sumInf_cost = 0;
    double sumBudget_cost = 0;
    // label miss nodes
    std::vector<std::pair<size_t, double>> miss_nodes_vec;
    // check if an edge is removed
    std::vector<bool> edgeMark_cost(__numRRsets, false);
    std::vector<bool> node_sel_cost(__numV, false);
    min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);

    Timer timerBound("Bound");
    __vecSeed_inf_cost.clear();
    for (size_t deg = maxDeg_cost; deg > 0; deg--) // Enusre deg > 0
    {
        if (sumBudget_cost + min_cost > budget) {
            break;
        }
        std::sort(degMap_cost[deg].begin(), degMap_cost[deg].end(), [](auto & left, auto & right) {
            return std::get<1>(left) < std::get<1>(right);
        });
        auto & vecNode = degMap_cost[deg];
        for (auto idx = vecNode.size(); idx--;) {
            auto argmaxIdx = std::get<0>(vecNode[idx]);
            const size_t currDeg = int(coverage_cost[argmaxIdx]) + 1;
            if (deg > currDeg) {
                degMap_cost[currDeg].push_back(std::make_pair(argmaxIdx, coverage_cost[argmaxIdx]));
                degMap_cost[deg].pop_back();
                continue;
            }
            if (sumBudget_cost + budget_list[argmaxIdx] <= budget) {
                if (mode == 2) {
                    timerBound.get_operation_time();
                    // Find upper bound
                    auto degBound = deg;
                    Nodelist vecBound;
                    double vecBound_Budget = 0;
                    // Initialize vecBound
                    auto idxBound = idx + 1;
                    int miss_idxBound = miss_nodes_vec.size() - 1;
                    bool is_stop = false;
                    for (size_t miss_idx = miss_nodes_vec.size(); miss_idx--; ) {
                        std::get<1>(miss_nodes_vec[miss_idx]) = coverage_cost[std::get<0>(miss_nodes_vec[miss_idx])];
                    }
                    std::sort(miss_nodes_vec.begin(), miss_nodes_vec.end(), [](auto & left, auto & right) {
                        return std::get<1>(left) < std::get<1>(right);
                    });
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && idxBound--) {
                            if (miss_idxBound >= 0) {
                                if (std::get<1>(degMap_cost[degBound][idxBound]) >= std::get<1>(miss_nodes_vec[miss_idxBound])) {
                                    if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                        vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                    }
                                    else {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           (budget - vecBound_Budget));
                                        vecBound_Budget = budget;
                                        is_stop = true;
                                        break;
                                    }
                                }
                                else {
                                    if (vecBound_Budget + budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])] <= budget) {
                                        vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                           budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])]);
                                        vecBound_Budget += budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])];
                                        miss_idxBound = miss_idxBound - 1;
                                    }
                                    else {
                                        vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                           (budget - vecBound_Budget));
                                        vecBound_Budget = budget;
                                        is_stop = true;
                                        break;
                                    }
                                }
                            }
                            else {
                                if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                    vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                       budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                    vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                }
                                else {
                                    vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                       (budget - vecBound_Budget));
                                    vecBound_Budget = budget;
                                    is_stop = true;
                                    break;
                                }
                            }
                        }
                    }
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && --degBound) {
                            std::sort(degMap_cost[degBound].begin(), degMap_cost[degBound].end(), [](auto & left, auto & right) {
                                return std::get<1>(left) < std::get<1>(right);
                            });
                            idxBound = degMap_cost[degBound].size();
                            while (vecBound_Budget + min_cost <= budget && idxBound--) {
                                if (miss_idxBound >= 0) {
                                    if (std::get<1>(degMap_cost[degBound][idxBound]) >= std::get<1>(miss_nodes_vec[miss_idxBound])) {
                                        if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                            vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                               budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                            vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                        }
                                        else {
                                            vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                               (budget - vecBound_Budget));
                                            vecBound_Budget = budget;
                                            is_stop = true;
                                            break;
                                        }
                                    }
                                    else {
                                        if (vecBound_Budget + budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])] <= budget) {
                                            vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                               budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])]);
                                            vecBound_Budget += budget_list[std::get<0>(miss_nodes_vec[miss_idxBound])];
                                            miss_idxBound = miss_idxBound - 1;
                                        }
                                        else {
                                            vecBound.push_back(std::get<1>(miss_nodes_vec[miss_idxBound]) *
                                                               (budget - vecBound_Budget));
                                            vecBound_Budget = budget;
                                            is_stop = true;
                                            break;
                                        }
                                    }
                                }
                                else {
                                    if (vecBound_Budget + budget_list[std::get<0>(degMap_cost[degBound][idxBound])] <= budget) {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           budget_list[std::get<0>(degMap_cost[degBound][idxBound])]);
                                        vecBound_Budget += budget_list[std::get<0>(degMap_cost[degBound][idxBound])];
                                    }
                                    else {
                                        vecBound.push_back(std::get<1>(degMap_cost[degBound][idxBound]) *
                                                           (budget - vecBound_Budget));
                                        vecBound_Budget = budget;
                                        is_stop = true;
                                        break;
                                    }
                                }
                            }
                            if (is_stop == true) {
                                break;
                            }
                        }
                    }
                    std::sort(vecBound.begin(), vecBound.end());
                    make_min_heap(vecBound);

                    __boundLast_inf_cost = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                                  + sumInf_cost) * __numV /__numRRsets;
                    if (__boundMin_inf_cost > __boundLast_inf_cost) {
                        __boundMin_inf_cost = __boundLast_inf_cost;
                    }
                    timeb += timerBound.get_operation_time();
                }
                sumInf_cost = sumInf_cost + coverage_cost[argmaxIdx] * budget_list[argmaxIdx];
                __vecSeed_inf_cost.push_back(argmaxIdx);
                sumBudget_cost = sumBudget_cost + budget_list[argmaxIdx];
                coverage_cost[argmaxIdx] = 0;
                node_sel_cost[argmaxIdx] = true;
                min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);
                for (auto edgeIdx : __hyperG._FRsets[argmaxIdx]) {
                    if (edgeMark_cost[edgeIdx]) {
                        continue;
                    }
                    edgeMark_cost[edgeIdx] = true;
                    for (auto nodeIdx : __hyperG._RRsets[edgeIdx]) {
                        if (coverage_cost[nodeIdx] == 0) {
                            continue; // This node is seed, skip
                        }
                        coverage_cost[nodeIdx] = (double) (coverage_cost[nodeIdx] * budget_list[nodeIdx] - 1) /
                                                 budget_list[nodeIdx];
                    }
                }
                degMap_cost[deg].pop_back();
                for (auto degup = deg; degup > 0; degup--) {
                    auto & vecNodeup = degMap_cost[degup];
                    for(auto idxup = vecNodeup.size(); idxup--;) {
                        std::get<1>(degMap_cost[degup][idxup]) = coverage_cost[std::get<0>(degMap_cost[degup][idxup])];
                    }
                }
                std::sort(degMap_cost[deg].begin(), degMap_cost[deg].end(), [](auto & left, auto & right) {
                    return std::get<1>(left) < std::get<1>(right);
                });
            }
            else{
                miss_nodes_vec.push_back(std::make_pair(argmaxIdx, coverage_cost[argmaxIdx]));
                degMap_cost[deg].pop_back();
            }
            if (sumBudget_cost + min_cost > budget) {
                break;
            }
        }
        degMap_cost.pop_back();
    }
    const auto finalInf_cost = 1.0 * sumInf_cost * __numV / __numRRsets;
    std::cout << "  >>>[greedy-lazy] influence_cost: " << sumInf_cost << " " <<
              finalInf_cost << ", min-bound_cost: " <<
              __boundMin_inf_cost << ", last-bound_cost: " << __boundLast_inf_cost << '\n';

    if (finalInf > finalInf_cost) {
        __vecSeed.assign(__vecSeed_inf.begin(), __vecSeed_inf.end());
        std::cout << "Inf: " <<  __vecSeed.size() << std::endl;
        __is_inf_cost = false;
        return finalInf;
    }
    else {
        __vecSeed.assign(__vecSeed_inf_cost.begin(), __vecSeed_inf_cost.end());
        std::cout << "Cost Inf: " << __vecSeed.size() << std::endl;
        __is_inf_cost = true;
        return finalInf_cost;
    }
}